

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::checkteamkills(void)

{
  bool bVar1;
  int iVar2;
  teamkillkick *ptVar3;
  teamkillinfo *ptVar4;
  teamkillinfo *tk;
  int i_1;
  int i;
  teamkillkick *kick;
  
  _i_1 = (teamkillkick *)0x0;
  if (((-4 < gamemode) && (gamemode < 0x17)) && ((gamemodes[gamemode + 3].flags & 0x7000U) == 0)) {
    for (tk._4_4_ = 0;
        iVar2 = vector<server::teamkillkick>::length((vector<server::teamkillkick> *)teamkillkicks),
        tk._4_4_ < iVar2; tk._4_4_ = tk._4_4_ + 1) {
      ptVar3 = vector<server::teamkillkick>::operator[]
                         ((vector<server::teamkillkick> *)teamkillkicks,tk._4_4_);
      bVar1 = teamkillkick::match(ptVar3,gamemode);
      if (bVar1) {
        if (_i_1 != (teamkillkick *)0x0) {
          ptVar3 = vector<server::teamkillkick>::operator[]
                             ((vector<server::teamkillkick> *)teamkillkicks,tk._4_4_);
          bVar1 = teamkillkick::includes(_i_1,ptVar3);
          if (!bVar1) goto LAB_001509fd;
        }
        _i_1 = vector<server::teamkillkick>::operator[]
                         ((vector<server::teamkillkick> *)teamkillkicks,tk._4_4_);
      }
LAB_001509fd:
    }
  }
  if (_i_1 != (teamkillkick *)0x0) {
    tk._0_4_ = vector<server::teamkillinfo>::length((vector<server::teamkillinfo> *)teamkills);
    while (tk._0_4_ = (int)tk + -1, -1 < (int)tk) {
      ptVar4 = vector<server::teamkillinfo>::operator[]
                         ((vector<server::teamkillinfo> *)teamkills,(int)tk);
      if (_i_1->limit <= ptVar4->teamkills) {
        if (0 < _i_1->ban) {
          addban(ptVar4->ip,_i_1->ban);
        }
        kickclients(ptVar4->ip,(clientinfo *)0x0);
        vector<server::teamkillinfo>::removeunordered
                  ((vector<server::teamkillinfo> *)teamkills,(int)tk);
      }
    }
  }
  shouldcheckteamkills = 0;
  return;
}

Assistant:

void checkteamkills()
    {
        teamkillkick *kick = NULL;
        if(m_timed) loopv(teamkillkicks) if(teamkillkicks[i].match(gamemode) && (!kick || kick->includes(teamkillkicks[i])))
            kick = &teamkillkicks[i];
        if(kick) loopvrev(teamkills)
        {
            teamkillinfo &tk = teamkills[i];
            if(tk.teamkills >= kick->limit)
            {
                if(kick->ban > 0) addban(tk.ip, kick->ban);
                kickclients(tk.ip);
                teamkills.removeunordered(i);
            }
        }
        shouldcheckteamkills = false;
    }